

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartFileMixingBasic.cpp
# Opt level: O1

void anon_unknown.dwarf_1ee5cf::fillPixels<float>(Array2D<float> *ph,int width,int height)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  float *pfVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  long lVar13;
  
  lVar10 = (long)width;
  uVar3 = height * lVar10;
  pfVar4 = (float *)operator_new__(-(ulong)(uVar3 >> 0x3e != 0) | uVar3 * 4);
  if (ph->_data != (float *)0x0) {
    operator_delete__(ph->_data);
  }
  ph->_sizeX = (long)height;
  ph->_sizeY = lVar10;
  ph->_data = pfVar4;
  auVar2 = _DAT_00207af0;
  auVar1 = _DAT_00207ae0;
  if (0 < height) {
    lVar6 = (ulong)(uint)width - 1;
    auVar11._8_4_ = (int)lVar6;
    auVar11._0_8_ = lVar6;
    auVar11._12_4_ = (int)((ulong)lVar6 >> 0x20);
    pfVar4 = pfVar4 + 1;
    uVar5 = 1;
    uVar7 = 0;
    auVar11 = auVar11 ^ _DAT_00207af0;
    uVar3 = 0;
    do {
      if (0 < width) {
        lVar6 = 0;
        auVar12 = auVar1;
        uVar8 = uVar7;
        uVar9 = uVar5;
        do {
          auVar14 = auVar12 ^ auVar2;
          if ((bool)(~(auVar11._4_4_ < auVar14._4_4_ ||
                      auVar11._0_4_ < auVar14._0_4_ && auVar14._4_4_ == auVar11._4_4_) & 1)) {
            *(float *)((long)pfVar4 + lVar6 + -4) =
                 (float)(int)(uVar8 - ((uVar8 / 0x801) * 0x800 + uVar8 / 0x801));
          }
          if (auVar14._12_4_ <= auVar11._12_4_ &&
              (auVar14._8_4_ <= auVar11._8_4_ || auVar14._12_4_ != auVar11._12_4_)) {
            *(float *)((long)pfVar4 + lVar6) =
                 (float)(int)(uVar9 - ((uVar9 / 0x801) * 0x800 + uVar9 / 0x801));
          }
          lVar13 = auVar12._8_8_;
          auVar12._0_8_ = auVar12._0_8_ + 2;
          auVar12._8_8_ = lVar13 + 2;
          uVar9 = uVar9 + 2;
          lVar6 = lVar6 + 8;
          uVar8 = uVar8 + 2;
        } while ((ulong)(width + 1U >> 1) << 3 != lVar6);
      }
      uVar3 = uVar3 + 1;
      uVar5 = uVar5 + width;
      pfVar4 = pfVar4 + lVar10;
      uVar7 = uVar7 + width;
    } while (uVar3 != (uint)height);
  }
  return;
}

Assistant:

void fillPixels (Array2D<T> &ph, int width, int height)
{
    ph.resizeErase(height, width);
    for (int y = 0; y < height; ++y)
        for (int x = 0; x < width; ++x)
        {
            //
            // We do this because half cannot store number bigger than 2048 exactly.
            //
            ph[y][x] = (y * width + x) % 2049;
        }
}